

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

vm_obj_id_t __thiscall CTPNConst::gen_code_obj_predot(CTPNConst *this,int *is_self)

{
  vm_obj_id_t vVar1;
  
  *is_self = 0;
  if ((this->super_CTPNConstBase).val_.typ_ == TC_CVT_OBJ) {
    vVar1 = (this->super_CTPNConstBase).val_.val_.propval_;
  }
  else {
    vVar1 = 0;
    CTcTokenizer::log_error(0x2cff);
  }
  return vVar1;
}

Assistant:

vm_obj_id_t CTPNConst::gen_code_obj_predot(int *is_self)
{
    /* we're certainly not "self" */
    *is_self = FALSE;

    /* if I don't have an object value, this is illegal */
    if (val_.get_type() != TC_CVT_OBJ)
    {
        G_tok->log_error(TCERR_INVAL_OBJ_EXPR);
        return VM_INVALID_OBJ;
    }

    /* report our constant object value */
    return val_.get_val_obj();
}